

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O0

bool __thiscall
MeCab::FeatureIndex::buildUnigramFeature(FeatureIndex *this,LearnerPath *path,char *ufeature)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  char **p_00;
  char **column;
  reference ppcVar4;
  ostream *poVar5;
  int *piVar6;
  FeatureIndex *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int id;
  char *r;
  char *p;
  const_iterator it;
  size_t usize;
  scoped_fixed_array<char_*,_64> F;
  scoped_fixed_array<char,_2048> ubuf;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffe88;
  char cVar7;
  vector<int,_std::allocator<int>_> *this_00;
  StringBuffer *in_stack_fffffffffffffe90;
  scoped_fixed_array<char_*,_64> *this_01;
  value_type_conflict *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffea8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffeb0;
  size_t in_stack_fffffffffffffec0;
  char **in_stack_fffffffffffffec8;
  ostream *in_stack_fffffffffffffed0;
  ChunkFreeList<int> *in_stack_fffffffffffffed8;
  StringBuffer *in_stack_fffffffffffffee0;
  FeatureIndex *this_02;
  die local_89;
  char *local_88;
  char *local_80;
  char **local_78;
  char **local_70;
  __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_68;
  size_t local_60;
  scoped_fixed_array<char_*,_64> local_48;
  scoped_fixed_array<char,_2048> local_30;
  FeatureIndex *local_18;
  long *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  scoped_fixed_array<char,_2048>::scoped_fixed_array
            ((scoped_fixed_array<char,_2048> *)in_stack_fffffffffffffe90);
  scoped_fixed_array<char_*,_64>::scoped_fixed_array
            ((scoped_fixed_array<char_*,_64> *)in_stack_fffffffffffffe90);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x110b9c);
  pcVar2 = scoped_fixed_array<char,_2048>::get(&local_30);
  sVar3 = scoped_fixed_array<char,_2048>::size(&local_30);
  strncpy(pcVar2,(char *)local_18,sVar3);
  p_00 = (char **)scoped_fixed_array<char,_2048>::get(&local_30);
  column = scoped_fixed_array<char_*,_64>::get(&local_48);
  sVar3 = scoped_fixed_array<char_*,_64>::size(&local_48);
  local_60 = tokenizeCSV<char**>((char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                                 in_stack_fffffffffffffec0);
  local_70 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                                (in_stack_fffffffffffffe88);
  __gnu_cxx::
  __normal_iterator<char_const*const*,std::vector<char_const*,std::allocator<char_const*>>>::
  __normal_iterator<char_const**>
            ((__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              *)in_stack_fffffffffffffe90,
             (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              *)in_stack_fffffffffffffe88);
  this_02 = local_18;
  do {
    local_78 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                                  (in_stack_fffffffffffffe88);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                        *)in_stack_fffffffffffffe90,
                       (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                        *)in_stack_fffffffffffffe88);
    if (!bVar1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
                 (value_type_conflict *)in_stack_fffffffffffffe88);
      this_01 = (scoped_fixed_array<char_*,_64> *)(in_RDI + 4);
      std::vector<int,_std::allocator<int>_>::size
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 1));
      piVar6 = ChunkFreeList<int>::alloc
                         (in_stack_fffffffffffffed8,(size_t)in_stack_fffffffffffffed0);
      *(int **)(*local_10 + 0x88) = piVar6;
      this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 1);
      std::vector<int,_std::allocator<int>_>::begin(this_00);
      std::vector<int,_std::allocator<int>_>::end(this_00);
      std::copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*>
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x11120e);
      scoped_fixed_array<char_*,_64>::~scoped_fixed_array(this_01);
      scoped_fixed_array<char,_2048>::~scoped_fixed_array((scoped_fixed_array<char,_2048> *)this_01)
      ;
      return true;
    }
    ppcVar4 = __gnu_cxx::
              __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&local_68);
    local_80 = *ppcVar4;
    StringBuffer::clear((StringBuffer *)(in_RDI + 0x27));
    for (; cVar7 = (char)((ulong)in_stack_fffffffffffffe88 >> 0x38), *local_80 != '\0';
        local_80 = local_80 + 1) {
      if (*local_80 == '%') {
        pcVar2 = local_80 + 1;
        cVar7 = local_80[1];
        local_80 = pcVar2;
        if (cVar7 == 'F') {
          scoped_fixed_array<char_*,_64>::get(&local_48);
          local_88 = getIndex(this_02,p_00,column,sVar3);
          if (local_88 == (char *)0x0) goto LAB_00111122;
          StringBuffer::operator<<(in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88);
        }
        else if (cVar7 == 't') {
          StringBuffer::operator<<
                    (in_stack_fffffffffffffee0,(unsigned_long)in_stack_fffffffffffffed8);
        }
        else if (cVar7 == 'u') {
          StringBuffer::operator<<(in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88);
        }
        else {
          if ((cVar7 == 'w') && (*(char *)(*local_10 + 0x57) == '\0')) {
            StringBuffer::write((StringBuffer *)(in_RDI + 0x27),
                                (int)*(undefined8 *)(*local_10 + 0x38),
                                (void *)(ulong)*(ushort *)(*local_10 + 0x4c),(size_t)pcVar2);
          }
          die::die(&local_89);
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                                  );
          in_stack_fffffffffffffee0 = (StringBuffer *)std::operator<<(poVar5,"(");
          in_stack_fffffffffffffed8 =
               (ChunkFreeList<int> *)std::ostream::operator<<(in_stack_fffffffffffffee0,0x16b);
          in_stack_fffffffffffffed0 = std::operator<<((ostream *)in_stack_fffffffffffffed8,") [");
          poVar5 = std::operator<<(in_stack_fffffffffffffed0,"false");
          poVar5 = std::operator<<(poVar5,"] ");
          poVar5 = std::operator<<(poVar5,"unknown meta char: ");
          in_stack_fffffffffffffeb0._M_current = (int *)std::operator<<(poVar5,*local_80);
          die::operator&(&local_89,(ostream *)in_stack_fffffffffffffeb0._M_current);
          die::~die((die *)0x111056);
        }
      }
      else if (*local_80 == '\\') {
        pcVar2 = local_80 + 1;
        local_80 = local_80 + 1;
        getEscapedChar(*pcVar2);
        StringBuffer::operator<<
                  (in_stack_fffffffffffffe90,(char)((ulong)in_stack_fffffffffffffe88 >> 0x38));
      }
      else {
        StringBuffer::operator<<(in_stack_fffffffffffffe90,cVar7);
      }
    }
    StringBuffer::operator<<(in_stack_fffffffffffffe90,cVar7);
    in_stack_fffffffffffffea8._M_current = (int *)StringBuffer::str((StringBuffer *)(in_RDI + 0x27))
    ;
    in_stack_fffffffffffffea4 =
         (**(code **)(*in_RDI + 0x30))(in_RDI,in_stack_fffffffffffffea8._M_current);
    if (in_stack_fffffffffffffea4 != -1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 in_stack_fffffffffffffe98);
    }
LAB_00111122:
    __gnu_cxx::
    __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
    ::operator++(&local_68);
  } while( true );
}

Assistant:

bool FeatureIndex::buildUnigramFeature(LearnerPath *path,
                                       const char *ufeature) {
  scoped_fixed_array<char, BUFSIZE> ubuf;
  scoped_fixed_array<char *, POSSIZE> F;

  feature_.clear();
  std::strncpy(ubuf.get(), ufeature, ubuf.size());
  const size_t usize = tokenizeCSV(ubuf.get(), F.get(), F.size());

  for (std::vector<const char*>::const_iterator it = unigram_templs_.begin();
       it != unigram_templs_.end(); ++it) {
    const char *p = *it;
    os_.clear();

    for (; *p; p++) {
      switch (*p) {
        default: os_ << *p; break;
        case '\\': os_ << getEscapedChar(*++p); break;
        case '%': {
          switch (*++p) {
            case 'F':  {
              const char *r = getIndex(const_cast<char **>(&p), F.get(), usize);
              if (!r) goto NEXT;
              os_ << r;
            } break;
            case 't':  os_ << (size_t)path->rnode->char_type;     break;
            case 'u':  os_ << ufeature; break;
            case 'w':
              if (path->rnode->stat == MECAB_NOR_NODE) {
                os_.write(path->rnode->surface, path->rnode->length);
              }
            default:
              CHECK_DIE(false) << "unknown meta char: " <<  *p;
          }
        }
      }
    }

    os_ << '\0';
    ADDB(os_.str());

 NEXT: continue;
  }

  COPY_FEATURE(path->rnode->fvector);

  return true;
}